

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio.c
# Opt level: O0

uint32_t FAudio_Release(FAudio *audio)

{
  uint32_t uVar1;
  FAudio *in_RDI;
  uint32_t refcount;
  
  in_RDI->refcount = in_RDI->refcount - 1;
  uVar1 = in_RDI->refcount;
  if (in_RDI->refcount == 0) {
    FAudio_StopEngine(in_RDI);
    (*in_RDI->pFree)(in_RDI->decodeCache);
    (*in_RDI->pFree)(in_RDI->resampleCache);
    (*in_RDI->pFree)(in_RDI->effectChainCache);
    FAudio_PlatformDestroyMutex((FAudioMutex)0x12178f);
    FAudio_PlatformDestroyMutex((FAudioMutex)0x12179d);
    FAudio_PlatformDestroyMutex((FAudioMutex)0x1217ab);
    (*in_RDI->pFree)(in_RDI);
    FAudio_PlatformRelease();
  }
  return uVar1;
}

Assistant:

uint32_t FAudio_Release(FAudio *audio)
{
	uint32_t refcount;
	LOG_API_ENTER(audio)
	audio->refcount -= 1;
	refcount = audio->refcount;
	if (audio->refcount == 0)
	{
		FAudio_StopEngine(audio);
		audio->pFree(audio->decodeCache);
		audio->pFree(audio->resampleCache);
		audio->pFree(audio->effectChainCache);
		LOG_MUTEX_DESTROY(audio, audio->sourceLock)
		FAudio_PlatformDestroyMutex(audio->sourceLock);
		LOG_MUTEX_DESTROY(audio, audio->submixLock)
		FAudio_PlatformDestroyMutex(audio->submixLock);
		LOG_MUTEX_DESTROY(audio, audio->callbackLock)
		FAudio_PlatformDestroyMutex(audio->callbackLock);
		audio->pFree(audio);
		FAudio_PlatformRelease();
	}
	else
	{
		LOG_API_EXIT(audio)
	}
	return refcount;
}